

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_anewarray(ExecutionEngine *this)

{
  cp_info *constantPool_00;
  Value operand;
  bool bVar1;
  VMStack *this_00;
  Frame *this_01;
  ostream *this_02;
  cp_info **ppcVar2;
  u1 *puVar3;
  cp_info *pcVar4;
  char *pcVar5;
  MethodArea *this_03;
  ArrayObject *this_04;
  Value VVar6;
  int local_ec;
  undefined4 uStack_e8;
  int i_1;
  Value nullValue;
  Value objectref;
  MethodArea *methodArea;
  int i;
  allocator local_89;
  string local_88 [8];
  string className;
  char cStack_60;
  CONSTANT_Class_info classInfo;
  cp_info classCP;
  uint16_t classIndex;
  u1 byte2;
  u1 byte1;
  u1 *code;
  cp_info *constantPool;
  Value count;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar6 = Frame::popTopOfOperandStack(this_01);
  constantPool._4_4_ = VVar6.type;
  if (constantPool._4_4_ != INT) {
    __assert_fail("count.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x112e,"void ExecutionEngine::i_anewarray()");
  }
  count.printType = VVar6.data._0_4_;
  if (-1 < (int)count.printType) {
    ppcVar2 = Frame::getConstantPool(this_01);
    constantPool_00 = *ppcVar2;
    puVar3 = Frame::getCode(this_01,this_01->pc);
    classCP.info._14_2_ = CONCAT11(puVar3[1],puVar3[2]);
    pcVar4 = constantPool_00 + (int)(CONCAT22(0,classCP.info._14_2_) - 1);
    cStack_60 = (char)*(undefined8 *)pcVar4;
    if (cStack_60 != '\a') {
      __assert_fail("classCP.tag == CONSTANT_Class",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0x113b,"void ExecutionEngine::i_anewarray()");
    }
    classCP._0_2_ = (pcVar4->info).long_info.high_bytes;
    pcVar5 = getFormattedConstant(constantPool_00,classCP._0_2_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,pcVar5,&local_89);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"java/lang/String");
    if (bVar1) {
      do {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
      } while (*pcVar5 == '[');
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
      if (*pcVar5 == 'L') {
        this_03 = MethodArea::getInstance();
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&objectref.data,(ulong)local_88);
        MethodArea::loadClassNamed(this_03,(string *)&objectref.data.booleanValue);
        std::__cxx11::string::~string((string *)&objectref.data.booleanValue);
      }
    }
    this_04 = (ArrayObject *)operator_new(0x28);
    ArrayObject::ArrayObject(this_04,REFERENCE);
    objectref._0_8_ = this_04;
    for (local_ec = 0; local_ec < (int)count.printType; local_ec = local_ec + 1) {
      VVar6.type = 9;
      VVar6.printType = uStack_e8;
      VVar6.data.longValue = 0;
      ArrayObject::pushValue((ArrayObject *)objectref._0_8_,VVar6);
    }
    operand.type = 9;
    operand.printType = nullValue.data.intValue;
    operand.data = (anon_union_8_10_52016fac_for_data)objectref._0_8_;
    Frame::pushIntoOperandStack(this_01,operand);
    this_01->pc = this_01->pc + 3;
    std::__cxx11::string::~string(local_88);
    return;
  }
  this_02 = std::operator<<((ostream *)&std::cerr,"NegativeArraySizeException");
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void ExecutionEngine::i_anewarray() {
    VMStack &stackFrame = VMStack::getInstance();       
    Frame *topFrame = stackFrame.getTopFrame();
    
    Value count = topFrame->popTopOfOperandStack(); // Número de elementos no array
    assert(count.type == ValueType::INT);
    if (count.data.intValue < 0) {
        cerr << "NegativeArraySizeException" << endl;
        exit(1);
    }
    
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);
    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t classIndex = (byte1 << 8) | byte2; // Índice na pool de constantes
    cp_info classCP = constantPool[classIndex-1];
    assert(classCP.tag == CONSTANT_Class);
    
    CONSTANT_Class_info classInfo = classCP.info.class_info; // Formata nome da classe
    string className = getFormattedConstant(constantPool, classInfo.name_index);

    if (className != "java/lang/String") {
        int i = 0;
        while (className[i] == '[') i++;
        if (className[i] == 'L') {
            MethodArea &methodArea = MethodArea::getInstance();
            methodArea.loadClassNamed(className.substr(i+1, className.size()-i-2)); // carrega a classe de referência (se ainda não foi).
        }
    }

    // criando objeto da classe instanciada
    Value objectref;
    objectref.type = ValueType::REFERENCE;
    objectref.data.object = new ArrayObject(ValueType::REFERENCE);
    
    // populando array com NULL
    Value nullValue;
    nullValue.type = ValueType::REFERENCE;
    nullValue.data.object = NULL;
    for (int i = 0; i < count.data.intValue; i++) {
        ((ArrayObject *) objectref.data.object)->pushValue(nullValue);
    }

    topFrame->pushIntoOperandStack(objectref);
    
    topFrame->pc += 3;
}